

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O1

uint8_t rfc5497_timetlv_get_from_vector(uint8_t *vector,size_t vector_length,uint8_t hopcount)

{
  uint8_t uVar1;
  ulong uVar2;
  
  uVar1 = 0xff;
  if ((vector_length & 1) != 0) {
    uVar2 = 1;
    if (1 < vector_length) {
      do {
        if (hopcount <= vector[uVar2]) break;
        uVar2 = uVar2 + 2;
      } while (uVar2 < vector_length);
    }
    uVar1 = vector[uVar2 - 1];
  }
  return uVar1;
}

Assistant:

uint8_t
rfc5497_timetlv_get_from_vector(const uint8_t *vector, size_t vector_length, uint8_t hopcount) {
  size_t i;

  /* handle illegal vector length */
  if ((vector_length & 1) == 0) {
    /* return infinite value */
    return 255;
  }

  for (i = 1; i < vector_length; i += 2) {
    /* find our position in the vector */
    if (hopcount <= vector[i]) {
      return vector[i - 1];
    }
  }

  /* use the last field of the vector */
  return vector[i - 1];
}